

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

void * __thiscall Js::CustomExternalWrapperObject::GetSlotData(CustomExternalWrapperObject *this)

{
  void **ppvVar1;
  void *local_28;
  WriteBarrierPtr<void> local_18;
  CustomExternalWrapperObject *local_10;
  CustomExternalWrapperObject *this_local;
  
  local_10 = this;
  if (this->slotType == External) {
    ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&(this->u).slot);
    Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&local_18,*ppvVar1);
    local_28 = unsafe_write_barrier_cast<void*,Memory::WriteBarrierPtr<void>>(&local_18);
  }
  else {
    local_28 = GetInlineSlots(this);
  }
  return local_28;
}

Assistant:

void * CustomExternalWrapperObject::GetSlotData() const
{
    return this->slotType == SlotType::External
        ? unsafe_write_barrier_cast<void *>(this->u.slot)
        : GetInlineSlots();
}